

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O2

handle pybind11::detail::
       eigen_array_cast<pybind11::detail::EigenProps<Eigen::Ref<Eigen::Matrix<double,_1,2,1,_1,2>,0,Eigen::OuterStride<_1>>>>
                 (Type *src,handle base,bool writeable)

{
  array aVar1;
  array a;
  array local_90;
  _Vector_base<long,_std::allocator<long>_> local_88;
  _Vector_base<long,_std::allocator<long>_> local_70;
  long local_58 [2];
  initializer_list<long> local_48;
  long local_38 [2];
  initializer_list<long> local_28;
  
  array::array(&a);
  local_38[0] = (src->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value;
  local_28._M_array = local_38;
  local_38[1] = 2;
  local_28._M_len = 2;
  any_container<long>::any_container<long,void>((any_container<long> *)&local_70,&local_28);
  local_58[0] = (src->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
                ).m_stride.m_outer.m_value << 3;
  local_48._M_array = local_58;
  local_58[1] = 8;
  local_48._M_len = 2;
  any_container<long>::any_container<long,void>((any_container<long> *)&local_88,&local_48);
  array::array<double>
            (&local_90,(ShapeContainer *)&local_70,(StridesContainer *)&local_88,
             (src->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data,base);
  pybind11::object::operator=((object *)&a,(object *)&local_90);
  pybind11::object::~object((object *)&local_90);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_88);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_70);
  aVar1 = a;
  if (!writeable) {
    *(byte *)((long)a.super_buffer.super_object.super_handle.m_ptr + 0x41) =
         *(byte *)((long)a.super_buffer.super_object.super_handle.m_ptr + 0x41) & 0xfb;
  }
  a.super_buffer.super_object.super_handle.m_ptr = (buffer)(object)0x0;
  pybind11::object::~object((object *)&a);
  return (handle)(PyObject *)aVar1.super_buffer.super_object.super_handle.m_ptr;
}

Assistant:

handle eigen_array_cast(typename props::Type const &src, handle base = handle(), bool writeable = true) {
    constexpr ssize_t elem_size = sizeof(typename props::Scalar);
    array a;
    if (props::vector)
        a = array({ src.size() }, { elem_size * src.innerStride() }, src.data(), base);
    else
        a = array({ src.rows(), src.cols() }, { elem_size * src.rowStride(), elem_size * src.colStride() },
                  src.data(), base);

    if (!writeable)
        array_proxy(a.ptr())->flags &= ~detail::npy_api::NPY_ARRAY_WRITEABLE_;

    return a.release();
}